

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::es30::isCoreQuery(QueryType query)

{
  undefined1 local_d;
  QueryType query_local;
  
  local_d = true;
  if ((((query != QUERY_TEXTURE_PARAM_INTEGER) &&
       (local_d = true, query != QUERY_TEXTURE_PARAM_FLOAT)) &&
      (local_d = true, query != QUERY_TEXTURE_PARAM_INTEGER_VEC4)) &&
     (((local_d = true, query != QUERY_TEXTURE_PARAM_FLOAT_VEC4 &&
       (local_d = true, query != QUERY_SAMPLER_PARAM_INTEGER)) &&
      ((local_d = true, query != QUERY_SAMPLER_PARAM_FLOAT &&
       (local_d = true, query != QUERY_SAMPLER_PARAM_INTEGER_VEC4)))))) {
    local_d = query == QUERY_SAMPLER_PARAM_FLOAT_VEC4;
  }
  return local_d;
}

Assistant:

static bool isCoreQuery (QueryType query)
{
	return	query == QUERY_TEXTURE_PARAM_INTEGER		||
			query == QUERY_TEXTURE_PARAM_FLOAT			||
			query == QUERY_TEXTURE_PARAM_INTEGER_VEC4	||
			query == QUERY_TEXTURE_PARAM_FLOAT_VEC4		||
			query == QUERY_SAMPLER_PARAM_INTEGER		||
			query == QUERY_SAMPLER_PARAM_FLOAT			||
			query == QUERY_SAMPLER_PARAM_INTEGER_VEC4	||
			query == QUERY_SAMPLER_PARAM_FLOAT_VEC4;
}